

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall front::syntax::SyntaxAnalyze::gm_comp_unit(SyntaxAnalyze *this)

{
  bool bVar1;
  
  hp_init_external_function(this);
  irGenerator::irGenerator::ir_begin_of_program(&this->irGenerator);
LAB_0017fbf0:
  do {
    if ((ulong)(((long)(this->word_list->
                       super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->word_list->
                      super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x30) <= this->matched_index + 1)
    {
      irGenerator::irGenerator::ir_end_of_program(&this->irGenerator);
      return;
    }
    bVar1 = try_word(this,1,INTTK,VOIDTK);
    if (bVar1) {
      bVar1 = try_word(this,2,IDENFR);
      if (bVar1) {
        bVar1 = try_word(this,3,LPARENT);
        if (bVar1) {
          gm_func_def(this);
          goto LAB_0017fbf0;
        }
      }
    }
    bVar1 = try_word(this,1,CONSTTK);
    if (bVar1) {
      gm_const_decl(this);
    }
    else {
      gm_var_decl(this);
    }
  } while( true );
}

Assistant:

void SyntaxAnalyze::gm_comp_unit() {
  hp_init_external_function();

  irGenerator.ir_begin_of_program();

  while (matched_index + 1 < word_list.size()) {
    if (try_word(1, Token::INTTK, Token::VOIDTK) &&
        try_word(2, Token::IDENFR) && try_word(3, Token::LPARENT)) {
      gm_func_def();
    } else if (try_word(1, Token::CONSTTK)) {
      gm_const_decl();
    } else {
      gm_var_decl();
    }
  }

  irGenerator.ir_end_of_program();
}